

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
          (String *__return_storage_ptr__,kj *this,char (*params) [21],StringPtr *params_1,
          char (*params_2) [16],String *params_3)

{
  char *pcVar1;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  kj *local_48;
  size_t local_40;
  ArrayPtr<const_char> local_38;
  
  local_40 = strlen((char *)this);
  local_58.ptr = *(char **)*params;
  local_58.size_ = *(long *)(*params + 8) - 1;
  local_48 = this;
  local_68.size_ = strlen((char *)params_1);
  pcVar1 = *(char **)(*params_2 + 8);
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = *(char **)*params_2;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  local_68.ptr = (char *)params_1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,&local_38,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}